

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O0

ssize_t __thiscall
apngasm::spec::priv::JSONSpecReaderImpl::read
          (JSONSpecReaderImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  void *filename;
  bool bVar1;
  ulong uVar2;
  reference_type puVar3;
  reference_type pbVar4;
  reference_type pbVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pbVar6;
  type ppVar7;
  size_type sVar8;
  reference pvVar9;
  data_type *pdVar10;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  byte local_4ea;
  byte local_49a;
  path local_410;
  path local_3e8;
  undefined1 local_3c0 [8];
  FrameInfo frameInfo;
  value_type *value_4;
  ptree *frame;
  Delay delay_1;
  string file;
  value_type *current_1;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_350;
  bool _foreach_continue158;
  auto_any_base *local_348;
  auto_any_t _foreach_end158;
  auto_any_base *local_338;
  auto_any_t _foreach_cur158;
  auto_any_t local_328;
  auto_any_t _foreach_col158;
  int delayIndex;
  undefined1 local_2e8 [8];
  optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  child_1;
  Delay delay;
  value_type *current;
  auto_any<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator>
  aStack_2c8;
  bool _foreach_continue145;
  auto_any_base *local_2c0;
  auto_any_t _foreach_end145;
  auto_any_base *local_2b0;
  auto_any_t _foreach_cur145;
  auto_any_t local_2a0;
  auto_any_t _foreach_col145;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  undefined1 local_260 [8];
  optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  child;
  vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_> delays;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined1 local_208 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value_3
  ;
  Delay defaultDelay;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  type local_19b;
  undefined1 local_198 [5];
  optional<bool> value_2;
  type local_164;
  optional<unsigned_int> value_1;
  undefined1 local_128 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  undefined1 local_d8 [8];
  path currentPath;
  path oldPath;
  locale local_78 [8];
  undefined1 local_70 [8];
  ptree root;
  string *filePath_local;
  JSONSpecReaderImpl *this_local;
  
  root.m_children = (void *)CONCAT44(in_register_00000034,__fd);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
  filename = root.m_children;
  std::locale::locale(local_78);
  boost::property_tree::json_parser::
  read_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((string *)filename,
             (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,local_78);
  std::locale::~locale(local_78);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)root.m_children,
             auto_format);
  uVar2 = std::filesystem::__cxx11::path::has_parent_path();
  if ((uVar2 & 1) != 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::current_path((path *)((long)&value.super_type.m_storage.dummy_ + 0x18));
    std::filesystem::__cxx11::path::~path((path *)((long)&value.super_type.m_storage.dummy_ + 0x18))
    ;
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&value_1.super_type.m_storage,"name",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_128,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)local_70,(path_type *)&value_1.super_type.m_storage);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&value_1.super_type.m_storage);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_128);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar5 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_128);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&(this->super_AbstractSpecReaderImpl)._name,pbVar5);
  }
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_128);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198,"loops",0x2e);
  local_164 = (type)boost::property_tree::
                    basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::get_optional<unsigned_int>
                              ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_70,(path_type *)local_198);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_198);
  bVar1 = boost::optional<unsigned_int>::operator!((optional<unsigned_int> *)&local_164);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    puVar3 = boost::optional<unsigned_int>::get((optional<unsigned_int> *)&local_164);
    (this->super_AbstractSpecReaderImpl)._loops = *puVar3;
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_1d0,"skip_first",0x2e);
  local_19b = (type)boost::property_tree::
                    basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::get_optional<bool>
                              ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_70,&local_1d0);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_1d0);
  bVar1 = boost::optional<bool>::operator!((optional<bool> *)&local_19b);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar4 = boost::optional<bool>::get((optional<bool> *)&local_19b);
    (this->super_AbstractSpecReaderImpl)._skipFirst = (bool)(*pbVar4 & 1);
  }
  value_3.super_type.m_storage.dummy_._24_8_ = 0x3e800000064;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_238,"default_delay",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_208,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)local_70,&local_238);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_238);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_208);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar5 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_208);
    bVar1 = anon_unknown_0::str2delay
                      (pbVar5,(Delay *)((long)&value_3.super_type.m_storage.dummy_ + 0x18));
    if (!bVar1) {
      value_3.super_type.m_storage.dummy_._24_8_ = 0x3e800000064;
    }
  }
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_208);
  std::vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>::vector
            ((vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_> *)
             &child);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_290,"delays",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_260,(path_type *)local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_290);
  bVar1 = boost::
          optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
          ::operator!((optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)local_260);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar6 = boost::
             optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             ::get((optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                    *)local_260);
    _foreach_cur145 =
         (auto_any_t)
         boost::foreach_detail_::
         contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                   (pbVar6,(false_ *)0x0);
    local_2a0 = (auto_any_t)&_foreach_cur145;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2a0);
    if (!bVar1) {
      _foreach_end145 =
           (auto_any_t)
           boost::foreach_detail_::
           begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                     (local_2a0,
                      (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                       *)0x0,(false_ *)0x0);
      local_2b0 = (auto_any_base *)&_foreach_end145;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2b0);
      if (!bVar1) {
        aStack_2c8 = boost::foreach_detail_::
                     end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                               (local_2a0,
                                (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                 *)0x0,(false_ *)0x0);
        local_2c0 = (auto_any_base *)&stack0xfffffffffffffd38;
        bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2c0);
        if (!bVar1) {
          current._7_1_ = 1;
          while( true ) {
            local_49a = 0;
            if ((current._7_1_ & 1) != 0) {
              bVar1 = boost::foreach_detail_::
                      done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                (local_2b0,local_2c0,
                                 (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                  *)0x0);
              local_49a = bVar1 ^ 0xff;
            }
            if ((local_49a & 1) == 0) break;
            bVar1 = boost::foreach_detail_::set_false((bool *)((long)&current + 7));
            if (!bVar1) {
              ppVar7 = boost::foreach_detail_::
                       deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                 (local_2b0,
                                  (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                   *)0x0);
              while (((current._7_1_ ^ 0xff) & 1) != 0) {
                pdVar10 = boost::property_tree::
                          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::data(&ppVar7->second);
                bVar1 = anon_unknown_0::str2delay(pdVar10,(Delay *)&child_1);
                if (!bVar1) {
                  child_1.ptr_ = (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)value_3.super_type.m_storage.dummy_._24_8_;
                }
                std::vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                ::push_back((vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                             *)&child,(value_type *)&child_1);
                current._7_1_ = 1;
              }
            }
            if ((current._7_1_ & 1) != 0) {
              boost::foreach_detail_::
              next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                        (local_2b0,
                         (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                          *)0x0);
            }
          }
        }
      }
    }
  }
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&delayIndex,"frames",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2e8,(path_type *)local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&delayIndex);
  bVar1 = boost::
          optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
          ::operator!((optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)local_2e8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    _foreach_col158._0_4_ = 0;
    pbVar6 = boost::
             optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             ::get((optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                    *)local_2e8);
    _foreach_cur158 =
         (auto_any_t)
         boost::foreach_detail_::
         contain<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
                   (pbVar6,(false_ *)0x0);
    local_328 = (auto_any_t)&_foreach_cur158;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_328);
    if (!bVar1) {
      _foreach_end158 =
           (auto_any_t)
           boost::foreach_detail_::
           begin<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                     (local_328,
                      (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                       *)0x0,(false_ *)0x0);
      local_338 = (auto_any_base *)&_foreach_end158;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_338);
      if (!bVar1) {
        aStack_350 = boost::foreach_detail_::
                     end<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                               (local_328,
                                (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                 *)0x0,(false_ *)0x0);
        local_348 = (auto_any_base *)&stack0xfffffffffffffcb0;
        bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_348);
        if (!bVar1) {
          current_1._7_1_ = 1;
          while( true ) {
            local_4ea = 0;
            if ((current_1._7_1_ & 1) != 0) {
              bVar1 = boost::foreach_detail_::
                      done<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                (local_338,local_348,
                                 (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                  *)0x0);
              local_4ea = bVar1 ^ 0xff;
            }
            if ((local_4ea & 1) == 0) break;
            bVar1 = boost::foreach_detail_::set_false((bool *)((long)&current_1 + 7));
            if (!bVar1) {
              ppVar7 = boost::foreach_detail_::
                       deref<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                                 (local_338,
                                  (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                                   *)0x0);
              while (((current_1._7_1_ ^ 0xff) & 1) != 0) {
                std::__cxx11::string::string((string *)&delay_1);
                pbVar6 = &ppVar7->second;
                bVar1 = boost::property_tree::
                        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty(pbVar6);
                if (bVar1) {
                  pdVar10 = boost::property_tree::
                            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::data(pbVar6);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &delay_1,pdVar10);
                  uVar2 = (ulong)(int)_foreach_col158;
                  sVar8 = std::
                          vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                          ::size((vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                                  *)&child);
                  if (uVar2 < sVar8) {
                    pvVar9 = std::
                             vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                             ::operator[]((vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>
                                           *)&child,(long)(int)_foreach_col158);
                    frame = *(ptree **)pvVar9;
                  }
                  else {
                    frame = (ptree *)value_3.super_type.m_storage.dummy_._24_8_;
                  }
                }
                else {
                  frameInfo.delay =
                       (Delay)boost::property_tree::
                              basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::front(pbVar6);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &delay_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)frameInfo.delay);
                  pdVar10 = boost::property_tree::
                            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::data((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)frameInfo.delay + 0x20));
                  bVar1 = anon_unknown_0::str2delay(pdVar10,(Delay *)&frame);
                  if (!bVar1) {
                    frame = (ptree *)value_3.super_type.m_storage.dummy_._24_8_;
                  }
                }
                std::filesystem::__cxx11::path::
                path<std::__cxx11::string,std::filesystem::__cxx11::path>
                          (&local_410,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &delay_1,auto_format);
                std::filesystem::absolute(&local_3e8);
                std::filesystem::__cxx11::path::string((string *)local_3c0,&local_3e8);
                frameInfo.filePath.field_2._8_8_ = frame;
                std::filesystem::__cxx11::path::~path(&local_3e8);
                std::filesystem::__cxx11::path::~path(&local_410);
                std::
                vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
                ::push_back(&(this->super_AbstractSpecReaderImpl)._frameInfos,
                            (value_type *)local_3c0);
                _foreach_col158._0_4_ = (int)_foreach_col158 + 1;
                anon_struct_40_2_3dd4d4e3::~FrameInfo((anon_struct_40_2_3dd4d4e3 *)local_3c0);
                std::__cxx11::string::~string((string *)&delay_1);
                current_1._7_1_ = 1;
              }
            }
            if ((current_1._7_1_ & 1) != 0) {
              boost::foreach_detail_::
              next<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>,mpl_::bool_<false>>
                        (local_338,
                         (type2type<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<false>_>
                          *)0x0);
            }
          }
        }
      }
    }
  }
  std::filesystem::current_path((path *)&currentPath._M_cmpts);
  std::vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_>::~vector
            ((vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_> *)
             &child);
  std::filesystem::__cxx11::path::~path((path *)local_d8);
  std::filesystem::__cxx11::path::~path((path *)&currentPath._M_cmpts);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool JSONSpecReaderImpl::read(const std::string& filePath)
      {
        // Read JSON file.
        boost::property_tree::ptree root;
        boost::property_tree::read_json(filePath, root);

        // Set current directory.
        const std::filesystem::path oldPath = std::filesystem::current_path();
        const std::filesystem::path currentPath = std::filesystem::path(filePath);
        if(currentPath.has_parent_path())
          std::filesystem::current_path(currentPath.parent_path());

        // Read fields.
        // name
        if( boost::optional<std::string> value = root.get_optional<std::string>("name") )
        {
          _name = value.get();
        }

        // loops
        if( boost::optional<unsigned int> value = root.get_optional<unsigned int>("loops") )
        {
          _loops = value.get();
        }

        // skip_first
        if( boost::optional<bool> value = root.get_optional<bool>("skip_first") )
        {
          _skipFirst = value.get();
        }

        // delay
        Delay defaultDelay = { DEFAULT_FRAME_NUMERATOR, DEFAULT_FRAME_DENOMINATOR };
        if( boost::optional<std::string> value = root.get_optional<std::string>("default_delay") )
        {
          if( !str2delay(value.get(), &defaultDelay) )
          {
            defaultDelay.num = DEFAULT_FRAME_NUMERATOR;
            defaultDelay.den = DEFAULT_FRAME_DENOMINATOR;
          }
        }

        std::vector<Delay> delays;
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("delays") )
        {
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            Delay delay;
            if( !str2delay(current.second.data(), &delay) )
              delay = defaultDelay;
            delays.push_back(delay);
          }
        }

        // frames
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("frames") )
        {
          int delayIndex = 0;
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            std::string file;
            Delay delay;
            const boost::property_tree::ptree& frame = current.second;

            // filepath only.
            if(frame.empty())
            {
              file = frame.data();
              if(delayIndex < delays.size())
                delay = delays[delayIndex];
              else
                delay = defaultDelay;
            }

            // filepath and delay
            else
            {
              const boost::property_tree::ptree::value_type& value = frame.front();
              file = value.first;
              if( !str2delay(value.second.data(), &delay) )
                delay = defaultDelay;
            }

            // Add frame informations.
            const FrameInfo frameInfo = { std::filesystem::absolute(file).string(), delay };
            _frameInfos.push_back(frameInfo);

            ++delayIndex;
          }
        }

        // Reset current directory.
        std::filesystem::current_path(oldPath);

        return true;
      }